

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O3

int qpdfjob_write_qpdf(qpdfjob_handle j,qpdf_data qpdf)

{
  int iVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  QUtil::setLineBuf(_stdout);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:115:28)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:115:28)>
             ::_M_manager;
  local_30._M_unused._M_object = qpdf;
  iVar1 = wrap_qpdfjob(j,(function<int_(_qpdfjob_handle_*)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int
qpdfjob_write_qpdf(qpdfjob_handle j, qpdf_data qpdf)
{
    QUtil::setLineBuf(stdout);
    return wrap_qpdfjob(j, [qpdf](qpdfjob_handle jh) {
        jh->j.writeQPDF(*(qpdf->qpdf));
        return jh->j.getExitCode();
    });
}